

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprand.h
# Opt level: O1

int * rprand_load_sequence(uint count,int min,int max)

{
  uint32_t uVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  iVar4 = max - min;
  iVar6 = -iVar4;
  if (0 < iVar4) {
    iVar6 = iVar4;
  }
  if (iVar6 + 1U < count) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)calloc((ulong)count,4);
    if (count != 0) {
      uVar5 = 0;
      do {
        uVar1 = rprand_xoshiro();
        iVar4 = uVar1 % (iVar6 + 1U) + min;
        if ((int)uVar5 != 0) {
          uVar3 = 0;
          do {
            if (piVar2[uVar3] == iVar4) goto LAB_001271ad;
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
        piVar2[uVar5] = iVar4;
        uVar5 = (ulong)((int)uVar5 + 1);
LAB_001271ad:
      } while ((uint)uVar5 < count);
    }
  }
  return piVar2;
}

Assistant:

int *rprand_load_sequence(unsigned int count, int min, int max)
{
    int *sequence = NULL;
    
    if (count > (unsigned int)(abs(max - min) + 1)) 
    {
        RPRAND_LOG("WARNING: Sequence count required is greater than range provided\n");
        //count = (max - min);
        return sequence;
    }

    sequence = (int *)RPRAND_CALLOC(count, sizeof(int));

    int value = 0;
    bool value_is_dup = false;

    for (unsigned int i = 0; i < count;)
    {
        value = ((unsigned int)rprand_xoshiro()%(abs(max - min) + 1)) + min;

        for (unsigned int j = 0; j < i; j++)
        {
            if (sequence[j] == value)
            {
                value_is_dup = true;
                break;
            }
        }

        if (!value_is_dup)
        {
            sequence[i] = value;
            i++;
        }

        value_is_dup = false;
    }

    return sequence;
}